

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O3

int init_config_path(AP_CTX *ctx)

{
  int iVar1;
  size_t sVar2;
  char *dst;
  int iVar3;
  char *__s;
  
  iVar3 = 0;
  if (ctx->config_path == (char *)0x0) {
    __s = ctx->default_dir;
    if (__s == (char *)0x0) {
      iVar1 = get_default_directory(ctx);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = create_directory(ctx->default_dir);
      if (iVar1 != 0) {
        return iVar1;
      }
      __s = ctx->default_dir;
    }
    sVar2 = strlen(__s);
    sVar2 = sVar2 + 0x12;
    dst = (char *)calloc(1,sVar2);
    ctx->config_path = dst;
    if (dst == (char *)0x0) {
      ap_log(AP_LOG_LEVEL_ERROR,"(%s) Can not allocate memory for \'ctx->config_path\'\n",
             ctx->client_ip);
      iVar3 = 4;
      if (ctx->config_path != (char *)0x0) {
        free(ctx->config_path);
      }
    }
    else {
      ap_str_strlcpy(dst,__s,sVar2);
      ap_str_strlcat(ctx->config_path,"/",sVar2);
      ap_str_strlcat(ctx->config_path,"authprogs.conf",sVar2);
    }
  }
  return iVar3;
}

Assistant:

static int init_config_path (AP_CTX *ctx)
{
	int				rc								= AP_NO_ERROR;
	size_t			size;
	BOOL			allocated_in_this_function		= FALSE;
	
	if (ctx->config_path == NULL)
	{
		if (ctx->default_dir == NULL)
		{
			rc = get_default_directory (ctx);
			if (rc != AP_NO_ERROR)
			{
				goto finish;
			}

			rc = create_directory (ctx->default_dir);
			if (rc != AP_NO_ERROR)
			{
				goto finish;
			}
		}

		allocated_in_this_function = TRUE;

		size = strlen (ctx->default_dir) + sizeof ("/") + sizeof (AP_DEFAULT_CONFIG_FILENAME) + 1;

		ctx->config_path = (char *) calloc (1, size);
		if (ctx->config_path == NULL)
		{
			ap_error ("(%s) Can not allocate memory for 'ctx->config_path'\n", ctx->client_ip);
			rc = AP_ERROR_NO_MEMORY;

			goto finish;
		}

		ap_str_strlcpy (ctx->config_path, ctx->default_dir, size);
		ap_str_strlcat (ctx->config_path, "/", size);
		ap_str_strlcat (ctx->config_path, AP_DEFAULT_CONFIG_FILENAME, size);
	}

finish:
	if (rc != AP_NO_ERROR)
	{
		if (allocated_in_this_function == TRUE)
		{
			if (ctx->config_path != NULL)
			{
				free (ctx->config_path);
			}
		}
	}

	return rc;
}